

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

void spvtools::opt::analysis::anon_unknown_0::SetInlinedOperand
               (Instruction *dbg_inlined_at,uint32_t inlined_operand)

{
  pointer pOVar1;
  CommonDebugInfoInstructions CVar2;
  ulong uVar3;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> __ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  undefined1 local_48 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_28;
  
  CVar2 = Instruction::GetCommonDebugOpcode(dbg_inlined_at);
  if (CVar2 != CommonDebugInfoDebugInlinedAt) {
    __assert_fail("dbg_inlined_at->GetCommonDebugOpcode() == CommonDebugInfoDebugInlinedAt",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x36,
                  "void spvtools::opt::analysis::(anonymous namespace)::SetInlinedOperand(Instruction *, uint32_t)"
                 );
  }
  pOVar1 = (dbg_inlined_at->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(dbg_inlined_at->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
          -0x5555555555555555;
  if ((uint)uVar3 < 7) {
    local_48._24_8_ = local_48 + 0x10;
    local_48._0_8_ = &PTR__SmallVector_00b02ef8;
    local_28._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_48._8_8_ = 1;
    local_78._0_4_ = 1;
    local_78._8_8_ = &PTR__SmallVector_00b02ef8;
    local_78._16_4_ = (array<signed_char,_4UL>)0x0;
    local_78._20_4_ = (array<signed_char,_4UL>)0x0;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_78 + 0x18)
    ;
    local_50._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_48._16_4_ = inlined_operand;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_48);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&dbg_inlined_at->operands_,(Operand *)local_78);
    local_78._8_8_ = &PTR__SmallVector_00b02ef8;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_50._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_50,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_50._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_50._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_48._0_8_ = &PTR__SmallVector_00b02ef8;
    if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
        local_28._M_head_impl ==
        (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
      return;
    }
    this = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_28;
    __ptr._M_head_impl = local_28._M_head_impl;
  }
  else {
    local_78._24_8_ = (long)local_78 + 0x10;
    local_78._0_8_ = &PTR__SmallVector_00b02ef8;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._16_4_ = inlined_operand;
    local_78._8_8_ = (_func_int **)0x1;
    if (uVar3 < 7) {
      __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2b8,
                    "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                   );
    }
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&pOVar1[6].words,(SmallVector<unsigned_int,_2UL> *)local_78);
    local_78._0_8_ = &PTR__SmallVector_00b02ef8;
    if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
        local_58._M_head_impl ==
        (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
      return;
    }
    this = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_58;
    __ptr._M_head_impl = local_58._M_head_impl;
  }
  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
            (this,__ptr._M_head_impl);
  return;
}

Assistant:

void SetInlinedOperand(Instruction* dbg_inlined_at, uint32_t inlined_operand) {
  assert(dbg_inlined_at);
  assert(dbg_inlined_at->GetCommonDebugOpcode() ==
         CommonDebugInfoDebugInlinedAt);
  if (dbg_inlined_at->NumOperands() <= kDebugInlinedAtOperandInlinedIndex) {
    dbg_inlined_at->AddOperand(
        {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inlined_operand}});
  } else {
    dbg_inlined_at->SetOperand(kDebugInlinedAtOperandInlinedIndex,
                               {inlined_operand});
  }
}